

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser_p.h
# Opt level: O0

void __thiscall QCss::Declaration::Declaration(Declaration *this,Declaration *param_2)

{
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *in_RSI;
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *in_stack_ffffffffffffffe8;
  
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::QExplicitlySharedDataPointer
            (in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

struct Q_GUI_EXPORT Declaration
{
    struct DeclarationData : public QSharedData
    {
        inline DeclarationData() : propertyId(UnknownProperty), important(false), inheritable(false) {}
        QString property;
        Property propertyId;
        QList<Value> values;
        QVariant parsed;
        bool important:1;
        bool inheritable:1;
    };
    QExplicitlySharedDataPointer<DeclarationData> d;
    inline Declaration() : d(new DeclarationData()) {}
    inline bool isEmpty() const { return d->property.isEmpty() && d->propertyId == UnknownProperty; }

    // helper functions
    QColor colorValue(const QPalette & = QPalette()) const;
    void colorValues(QColor *c, const QPalette & = QPalette()) const;
    QBrush brushValue(const QPalette & = QPalette()) const;
    void brushValues(QBrush *c, const QPalette & = QPalette()) const;

    BorderStyle styleValue() const;
    void styleValues(BorderStyle *s) const;

    Origin originValue() const;
    Repeat repeatValue() const;
    Qt::Alignment alignmentValue() const;
    PositionMode positionValue() const;
    Attachment attachmentValue() const;
    int  styleFeaturesValue() const;

    bool intValue(int *i, const char *unit = nullptr) const;
    bool realValue(qreal *r, const char *unit = nullptr) const;

    QSize sizeValue() const;
    QRect rectValue() const;
    QString uriValue() const;
    QIcon iconValue() const;

    void borderImageValue(QString *image, int *cuts, TileMode *h, TileMode *v) const;
    bool borderCollapseValue() const;

    QList<qreal> dashArray() const;
}